

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

MakeNet * __thiscall
notch::core::MakeNet::addFC(MakeNet *this,Array *weights,Array *bias,Activation *af)

{
  ulong uVar1;
  logic_error *this_00;
  LayerType local_6c;
  MakeLayer mk;
  
  uVar1 = bias->_M_size;
  if (weights->_M_size / uVar1 == this->nOutputs) {
    checkConfig(this);
    MakeLayer::MakeLayer(&mk,weights,bias,af);
    std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
              (&this->layerMakers,&mk);
    local_6c = FC;
    std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
    emplace_back<notch::core::MakeNet::LayerType>(&this->layerTypes,&local_6c);
    this->nOutputs = uVar1;
    MakeLayer::~MakeLayer(&mk);
    return this;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10,weights,weights->_M_size % uVar1);
  ::std::logic_error::logic_error(this_00,"cannot add a layer with an incompatible weight matrix");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

MakeNet &addFC(const Array &weights, const Array &bias,
                   const Activation &af = scaledTanh) {
        size_t w_rows = bias.size();
        size_t w_cols = weights.size() / w_rows;
        if (w_cols != nOutputs) {
            throw std::logic_error("cannot add a layer with an incompatible weight matrix");
        }
        checkConfig();
        MakeLayer mk(weights, bias, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        nOutputs = w_rows;
        return *this;
    }